

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O3

vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> * __thiscall
Blob_Detection::BlobDetection::find
          (BlobDetection *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
          BlobParameters parameter,uint8_t threshold)

{
  pointer *ppuVar1;
  pointer *this_00;
  double dVar2;
  pointer pBVar3;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  BlobDetection *pBVar8;
  uint uVar9;
  pointer puVar10;
  size_t siglen;
  undefined4 in_register_00000014;
  uchar *sig;
  uchar *puVar11;
  pointer puVar12;
  iterator __j;
  uchar *puVar13;
  pointer pBVar14;
  ulong uVar15;
  EVP_PKEY_CTX *ctx;
  long lVar16;
  iterator iVar17;
  ulong uVar18;
  uint32_t uVar19;
  undefined4 in_register_0000008c;
  char cVar20;
  uint uVar21;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar25;
  uint32_t yMap;
  uint local_1d8;
  uint local_1d4;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1d0;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1c8;
  undefined1 local_1c0 [104];
  undefined1 local_158 [144];
  Value<unsigned_int> VStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  double dStack_b0;
  double dStack_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double dStack_88;
  undefined8 uStack_80;
  Value<unsigned_int> VStack_78;
  double dStack_70;
  undefined8 uStack_68;
  Value<unsigned_int> VStack_60;
  BlobDetection *local_50;
  pointer local_48;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_40;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  local_1c0._32_8_ = CONCAT44(in_register_00000014,x);
  ctx = (EVP_PKEY_CTX *)(ulong)x;
  siglen = (size_t)width;
  puVar11 = (uchar *)(ulong)height;
  uVar19 = height;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  BlobParameters::_verify(&parameter,ctx,sig,siglen,puVar11,CONCAT44(in_register_0000008c,uVar19));
  local_50 = this;
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_erase_at_end
            (&this->_blob,
             (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start);
  puVar10 = (pointer)(ulong)(width + 2);
  local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1c0 + 0x50),
             (ulong)((height + 2) * (width + 2)),local_158,(allocator_type *)local_1c0);
  uVar9 = image->_rowSize;
  uVar15 = (ulong)width;
  if (height * uVar9 != 0) {
    puVar11 = image->_data + (local_1c0._32_8_ & 0xffffffff) + (ulong)(uVar9 * y);
    lVar16 = CONCAT44(local_1c0._84_4_,local_1c0._80_4_) + 1;
    puVar13 = puVar11 + height * uVar9;
    do {
      lVar16 = lVar16 + (long)puVar10;
      if (width != 0) {
        uVar18 = 0;
        do {
          if (threshold <= puVar11[uVar18]) {
            *(undefined1 *)(lVar16 + uVar18) = 1;
          }
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      puVar11 = puVar11 + uVar9;
    } while (puVar11 != puVar13);
  }
  local_1c0._0_8_ = local_1c0;
  puVar12 = (pointer)(CONCAT44(local_1c0._84_4_,local_1c0._80_4_) + (long)puVar10);
  local_1c0._16_8_ = (pointer)0x0;
  local_48 = (pointer)(local_1c0._88_8_ - (long)puVar10);
  local_1c0._8_8_ = local_1c0._0_8_;
  local_1c0._24_8_ = (pointer)(ulong)y;
  local_1c0._40_8_ = puVar10;
  if (puVar12 != local_48) {
    local_1c0._64_4_ = y - 1;
    local_1c0._56_8_ = -(long)puVar10;
    local_1c0._68_4_ = (int)local_1c0._32_8_ + -1;
    do {
      local_1c0._48_8_ = puVar12;
      if ((char)*puVar12 == '\x01') {
        local_98 = 0.0;
        uStack_90._0_1_ = false;
        uStack_90._1_7_ = 0;
        dStack_88 = 0.0;
        uStack_80._0_1_ = false;
        uStack_80._1_7_ = 0;
        VStack_78.value = 0;
        VStack_78.found = false;
        VStack_78._5_3_ = 0;
        dStack_70 = 0.0;
        uStack_68._0_1_ = false;
        uStack_68._1_7_ = 0;
        VStack_60.value = 0;
        VStack_60.found = false;
        VStack_60._5_3_ = 0;
        local_158._128_8_ = (pointer)0x0;
        local_158._136_8_ = (pointer)0x0;
        VStack_c8.value = 0;
        VStack_c8.found = false;
        VStack_c8._5_3_ = 0;
        uStack_c0._0_4_ = 0;
        uStack_c0._4_4_ = 0;
        uStack_b8._0_1_ = false;
        uStack_b8._1_3_ = 0;
        uStack_b8._4_4_ = 0;
        dStack_b0 = 0.0;
        dStack_a8 = 0.0;
        uStack_a0._0_1_ = false;
        uStack_a0._1_7_ = 0;
        local_158._64_8_ = (pointer)0x0;
        local_158._72_8_ = (pointer)0x0;
        local_158._80_8_ = (pointer)0x0;
        local_158._88_8_ = (pointer)0x0;
        local_158._96_8_ = (pointer)0x0;
        local_158._104_8_ = (pointer)0x0;
        local_158._112_8_ = (pointer)0x0;
        local_158._120_4_ = 0;
        local_158[0x7c] = false;
        local_158._125_3_ = 0;
        local_158._0_8_ = (pointer)0x0;
        local_158._8_8_ = (pointer)0x0;
        local_158._16_8_ = (pointer)0x0;
        local_158._24_8_ = (pointer)0x0;
        local_158._32_8_ = (pointer)0x0;
        local_158._40_8_ = (pointer)0x0;
        local_158._48_8_ = (pointer)0x0;
        local_158._56_8_ = (pointer)0x0;
        std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
        _M_insert<Blob_Detection::BlobInfo>
                  ((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                   local_1c0,(iterator)local_1c0,(BlobInfo *)local_158);
        uVar6 = local_1c0._48_8_;
        if ((Value<unsigned_int>)local_158._120_8_ != (Value<unsigned_int>)0x0) {
          operator_delete((void *)local_158._120_8_);
        }
        if ((pointer)local_158._96_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._96_8_);
        }
        if ((pointer)local_158._72_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._72_8_);
        }
        if ((pointer)local_158._48_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._48_8_);
        }
        if ((pointer)local_158._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._24_8_);
        }
        if ((pointer)local_158._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._0_8_);
        }
        uVar5 = local_1c0._8_8_;
        uVar9 = (int)uVar6 - local_1c0._80_4_;
        ppuVar1 = &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0._8_8_)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        uVar21 = uVar9 / (uint)local_1c0._40_4_;
        local_1c0._72_4_ = uVar9 % (uint)local_1c0._40_4_ + local_1c0._68_4_;
        local_158._0_4_ = local_1c0._72_4_;
        iVar17._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1c0._8_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar17._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1c0._8_8_ + 0x18))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar17,
                     (uint *)local_158);
        }
        else {
          *iVar17._M_current = local_1c0._72_4_;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1c0._8_8_ + 0x18))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar17._M_current + 1;
        }
        uVar21 = uVar21 + local_1c0._64_4_;
        this_00 = &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_158._0_4_ = uVar21;
        iVar17._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        local_1c8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)ppuVar1;
        if (iVar17._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar17,
                     (uint *)local_158);
        }
        else {
          *iVar17._M_current = uVar21;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar17._M_current + 1;
        }
        local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        *(char *)uVar6 = '\x02';
        local_40 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x78))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        lVar16 = 0;
        puVar10 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)uVar5)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        local_1d0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this_00;
        local_1c0._76_4_ = uVar21;
        do {
          uVar9 = puVar10[lVar16];
          local_158._0_4_ = uVar9;
          local_1d4 = (*(pointer *)local_1d0)[lVar16];
          lVar22 = (ulong)((uVar9 - local_1c0._32_4_) + 1) +
                   (ulong)(((local_1d4 - local_1c0._24_4_) + 1) * local_1c0._40_4_) +
                   CONCAT44(local_1c0._84_4_,local_1c0._80_4_);
          cVar20 = *(char *)(local_1c0._56_8_ + lVar22 + -1);
          pcVar23 = (char *)(lVar22 + local_1c0._56_8_);
          if (cVar20 != '\0') {
            if (cVar20 == '\x01') {
              local_1d8 = uVar9 - 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              local_1d8 = local_1d4 - 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              pcVar23[-1] = '\x02';
            }
            cVar20 = '\x01';
          }
          if (*pcVar23 != '\0') {
            if (*pcVar23 == '\x01') {
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1c8,iVar17,(uint *)local_158);
              }
              else {
                *iVar17._M_current = local_158._0_4_;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              local_1d8 = local_1d4 - 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              *pcVar23 = '\x02';
            }
            cVar20 = cVar20 + '\x01';
          }
          pcVar24 = pcVar23 + 1;
          if (pcVar23[1] != '\0') {
            if (pcVar23[1] == '\x01') {
              local_1d8 = local_158._0_4_ + 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              local_1d8 = local_1d4 - 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              *pcVar24 = '\x02';
            }
            cVar20 = cVar20 + '\x01';
          }
          pcVar23 = pcVar24 + uVar15;
          if (pcVar24[uVar15] != '\0') {
            if (pcVar24[uVar15] == '\x01') {
              local_1d8 = local_158._0_4_ - 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1d0,iVar17,&local_1d4);
              }
              else {
                *iVar17._M_current = local_1d4;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              *pcVar23 = '\x02';
            }
            cVar20 = cVar20 + '\x01';
          }
          pcVar24 = pcVar23 + 2;
          if (pcVar23[2] != '\0') {
            if (pcVar23[2] == '\x01') {
              local_1d8 = local_158._0_4_ + 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1d0,iVar17,&local_1d4);
              }
              else {
                *iVar17._M_current = local_1d4;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              *pcVar24 = '\x02';
            }
            cVar20 = cVar20 + '\x01';
          }
          pcVar23 = pcVar24 + uVar15;
          if (pcVar24[uVar15] != '\0') {
            if (pcVar24[uVar15] == '\x01') {
              local_1d8 = local_158._0_4_ - 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              local_1d8 = local_1d4 + 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              *pcVar23 = '\x02';
            }
            cVar20 = cVar20 + '\x01';
          }
          if (pcVar23[1] != '\0') {
            if (pcVar23[1] == '\x01') {
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1c8,iVar17,(uint *)local_158);
              }
              else {
                *iVar17._M_current = local_158._0_4_;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              local_1d8 = local_1d4 + 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              pcVar23[1] = '\x02';
            }
            cVar20 = cVar20 + '\x01';
          }
          if (pcVar23[2] == '\0') {
LAB_00105320:
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x78))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x78))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_38,iVar17,(uint *)local_158);
            }
            else {
              *iVar17._M_current = local_158._0_4_;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x78))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            iVar17._M_current = *(uint **)&((Value<Blob_Detection::Area> *)(uVar5 + 0x90))->value;
            if (iVar17._M_current ==
                *(uint **)&(((Value<Blob_Detection::Area> *)(uVar5 + 0x90))->value).top) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_40,iVar17,&local_1d4);
            }
            else {
              *iVar17._M_current = local_1d4;
              *(uint **)&((Value<Blob_Detection::Area> *)(uVar5 + 0x90))->value =
                   iVar17._M_current + 1;
            }
            (pcVar23 + 1)[local_1c0._56_8_] = '\x03';
          }
          else {
            if (pcVar23[2] == '\x01') {
              local_1d8 = local_158._0_4_ + 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              local_1d8 = local_1d4 + 1;
              iVar17._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar17._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                           &local_1d8);
              }
              else {
                *iVar17._M_current = local_1d8;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar17._M_current + 1;
              }
              pcVar23[2] = '\x02';
            }
            if (cVar20 != '\a') goto LAB_00105320;
          }
          uVar7 = local_1c0._76_4_;
          puVar10 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)uVar5)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          lVar16 = lVar16 + 1;
        } while (lVar16 != (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (uVar5 + 0x18))->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start - (long)puVar10 >> 2);
        ppuVar1 = &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_158._0_4_ = local_1c0._72_4_;
        iVar17._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar17._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar17,
                     (uint *)local_158);
        }
        else {
          *iVar17._M_current = local_1c0._72_4_;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar17._M_current + 1;
        }
        puVar10 = (pointer)local_1c0._24_8_;
        local_158._0_4_ = uVar7;
        pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                  &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        iVar17._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        local_1c8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)ppuVar1;
        if (iVar17._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar25,iVar17,
                     (uint *)local_158);
        }
        else {
          *iVar17._M_current = uVar7;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar17._M_current + 1;
        }
        lVar16 = 0;
        *(char *)local_1c0._48_8_ = '\x04';
        puVar12 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        iVar17._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        local_1d0 = pvVar25;
        do {
          uVar9 = puVar12[lVar16];
          local_158._0_4_ = uVar9;
          local_1d4 = (*(pointer *)pvVar25)[lVar16];
          lVar22 = (ulong)((uVar9 - local_1c0._32_4_) + 1) +
                   (ulong)(((local_1d4 - (int)puVar10) + 1) * local_1c0._40_4_) +
                   CONCAT44(local_1c0._84_4_,local_1c0._80_4_);
          pcVar23 = (char *)(lVar22 + local_1c0._56_8_);
          if (*(char *)(local_1c0._56_8_ + lVar22 + -1) == '\x03') {
            local_1d8 = uVar9 - 1;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            local_1d8 = local_1d4 - 1;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar25,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            pcVar23[-1] = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (*pcVar23 == '\x03') {
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_1c8,iVar17,(uint *)local_158);
            }
            else {
              *iVar17._M_current = local_158._0_4_;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            pvVar25 = local_1d0;
            local_1d8 = local_1d4 - 1;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            *pcVar23 = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pcVar24 = pcVar23 + 1;
          if (pcVar23[1] == '\x03') {
            local_1d8 = local_158._0_4_ + 1;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            local_1d8 = local_1d4 - 1;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar25,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            *pcVar24 = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pcVar23 = pcVar24 + uVar15;
          puVar10 = (pointer)local_1c0._24_8_;
          if (pcVar24[uVar15] == '\x03') {
            local_1d8 = local_158._0_4_ - 1;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            puVar10 = (pointer)local_1c0._24_8_;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_1d0,iVar17,&local_1d4);
            }
            else {
              *iVar17._M_current = local_1d4;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            *pcVar23 = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pvVar25 = local_1d0;
          pcVar24 = pcVar23 + 2;
          if (pcVar23[2] == '\x03') {
            local_1d8 = local_158._0_4_ + 1;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar25,iVar17,&local_1d4);
            }
            else {
              *iVar17._M_current = local_1d4;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            *pcVar24 = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pvVar25 = local_1d0;
          if (pcVar24[uVar15] == '\x03') {
            local_1d8 = local_158._0_4_ - 1;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            local_1d8 = local_1d4 + 1;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar25,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            pcVar24[uVar15] = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (pcVar23[uVar15 + 3] == '\x03') {
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_1c8,iVar17,(uint *)local_158);
            }
            else {
              *iVar17._M_current = local_158._0_4_;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            pvVar25 = local_1d0;
            local_1d8 = local_1d4 + 1;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            pcVar23[uVar15 + 3] = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (pcVar23[uVar15 + 4] == '\x03') {
            local_1d8 = local_158._0_4_ + 1;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            local_1d8 = local_1d4 + 1;
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar17._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar25,iVar17,
                         &local_1d8);
            }
            else {
              *iVar17._M_current = local_1d8;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar17._M_current + 1;
            }
            pcVar23[uVar15 + 4] = '\x04';
            iVar17._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar5 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          }
          lVar16 = lVar16 + 1;
          puVar12 = *(pointer *)local_1c8;
        } while (lVar16 != (long)iVar17._M_current - (long)puVar12 >> 2);
      }
      puVar12 = (pointer)(local_1c0._48_8_ + 1);
    } while (puVar12 != local_48);
  }
  pBVar8 = local_50;
  pBVar3 = (pointer)local_1c0._0_8_;
  if ((parameter.circularity.checkMaximum != false) || (parameter.circularity.checkMinimum == true))
  {
    for (; pBVar3 != (pointer)local_1c0;
        pBVar3 = (pointer)(pBVar3->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      BlobInfo::_getCircularity
                ((BlobInfo *)
                 &(pBVar3->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar3 = (pointer)local_1c0._0_8_;
    local_158._0_8_ = (pointer)local_158;
    local_158._8_8_ = (pointer)local_158;
    while (pBVar14 = pBVar3, pBVar14 != (pointer)local_1c0) {
      dVar2 = (pBVar14->_elongation).value;
      pBVar3 = (pointer)(pBVar14->_pointX).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      if ((((parameter.circularity.checkMaximum == true) && (parameter.circularity.maximum < dVar2))
          || ((parameter.circularity.checkMinimum == true && (dVar2 < parameter.circularity.minimum)
              ))) && (pBVar3 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar14)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar14);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c0._16_8_ = local_1c0._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  }
  pBVar3 = (pointer)local_1c0._0_8_;
  if ((parameter.elongation.checkMaximum != false) || (parameter.elongation.checkMinimum == true)) {
    for (; pBVar3 != (pointer)local_1c0;
        pBVar3 = (pointer)(pBVar3->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      BlobInfo::_getElongation
                ((BlobInfo *)
                 &(pBVar3->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar3 = (pointer)local_1c0._0_8_;
    local_158._0_8_ = (pointer)local_158;
    local_158._8_8_ = (pointer)local_158;
    while (pBVar14 = pBVar3, pBVar14 != (pointer)local_1c0) {
      pBVar3 = (pointer)(pBVar14->_pointX).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      if ((((parameter.elongation.checkMaximum == true) &&
           (parameter.elongation.maximum < (double)pBVar14->_height)) ||
          ((parameter.elongation.checkMinimum == true &&
           ((double)pBVar14->_height < parameter.elongation.minimum)))) &&
         (pBVar3 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar14)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar14);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c0._16_8_ = local_1c0._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  }
  pBVar3 = (pointer)local_1c0._0_8_;
  if ((parameter.height.checkMaximum != false) || (parameter.height.checkMinimum == true)) {
    for (; pBVar3 != (pointer)local_1c0;
        pBVar3 = (pointer)(pBVar3->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      BlobInfo::_getHeight
                ((BlobInfo *)
                 &(pBVar3->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar3 = (pointer)local_1c0._0_8_;
    local_158._0_8_ = (pointer)local_158;
    local_158._8_8_ = (pointer)local_158;
    while (pBVar14 = pBVar3, pBVar14 != (pointer)local_1c0) {
      pBVar3 = (pointer)(pBVar14->_pointX).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      uVar9 = *(uint *)&(pBVar14->_length).found;
      if ((((parameter.height.checkMaximum == true) && (parameter.height.maximum < uVar9)) ||
          ((parameter.height.checkMinimum == true && (uVar9 < parameter.height.minimum)))) &&
         (pBVar3 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar14)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar14);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c0._16_8_ = local_1c0._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  }
  pBVar3 = (pointer)local_1c0._0_8_;
  if ((parameter.length.checkMaximum != false) || (parameter.length.checkMinimum == true)) {
    for (; pBVar3 != (pointer)local_1c0;
        pBVar3 = (pointer)(pBVar3->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      BlobInfo::_getLength
                ((BlobInfo *)
                 &(pBVar3->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar3 = (pointer)local_1c0._0_8_;
    local_158._0_8_ = (pointer)local_158;
    local_158._8_8_ = (pointer)local_158;
    while (pBVar14 = pBVar3, pBVar14 != (pointer)local_1c0) {
      pBVar3 = (pointer)(pBVar14->_pointX).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      if ((((parameter.length.checkMaximum == true) &&
           (parameter.length.maximum < (double)pBVar14->_width)) ||
          ((parameter.length.checkMinimum == true &&
           ((double)pBVar14->_width < parameter.length.minimum)))) &&
         (pBVar3 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar14)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar14);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c0._16_8_ = local_1c0._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  }
  if ((parameter.size.checkMaximum != false) || (parameter.size.checkMinimum == true)) {
    local_158._16_8_ = (pointer)0x0;
    pBVar3 = (pointer)local_1c0._0_8_;
    local_158._0_8_ = (pointer)local_158;
    local_158._8_8_ = (pointer)local_158;
    while (pBVar14 = pBVar3, pBVar14 != (pointer)local_1c0) {
      pBVar3 = (pointer)(pBVar14->_pointX).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar10 = (pBVar14->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar12 = (pBVar14->_pointY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((((parameter.size.checkMaximum == true) &&
           ((ulong)parameter.size.maximum < (ulong)((long)puVar12 - (long)puVar10 >> 2))) ||
          ((parameter.size.checkMinimum == true &&
           ((ulong)((long)puVar12 - (long)puVar10 >> 2) < (ulong)parameter.size.minimum)))) &&
         (pBVar3 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar14)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar14);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c0._16_8_ = local_1c0._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  }
  pBVar3 = (pointer)local_1c0._0_8_;
  if ((parameter.width.checkMaximum != false) || (parameter.width.checkMinimum == true)) {
    for (; pBVar3 != (pointer)local_1c0;
        pBVar3 = (pointer)(pBVar3->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      BlobInfo::_getWidth((BlobInfo *)
                          &(pBVar3->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar3 = (pointer)local_1c0._0_8_;
    local_158._0_8_ = (pointer)local_158;
    local_158._8_8_ = (pointer)local_158;
    while (pBVar14 = pBVar3, pBVar14 != (pointer)local_1c0) {
      pBVar3 = (pointer)(pBVar14->_pointX).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      uVar9 = *(uint *)&pBVar14[1]._pointX.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      if ((((parameter.width.checkMaximum == true) && (parameter.width.maximum < uVar9)) ||
          ((parameter.width.checkMinimum == true && (uVar9 < parameter.width.minimum)))) &&
         (pBVar3 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar14)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar14);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c0._16_8_ = local_1c0._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  }
  std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
  vector<std::_List_iterator<Blob_Detection::BlobInfo>,void>
            ((vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>> *)local_158,
             (_List_iterator<Blob_Detection::BlobInfo>)local_1c0._0_8_,(_List_node_base *)local_1c0,
             (allocator_type *)&local_1d4);
  pBVar3 = (pBVar8->_blob).
           super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar8->_blob).
  super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_158._16_8_;
  pBVar14 = (pBVar8->_blob).
            super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (pBVar8->_blob).
           super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (pBVar8->_blob).
  super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_158._0_8_;
  (pBVar8->_blob).
  super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_158._8_8_;
  local_158._0_8_ = pBVar14;
  local_158._8_8_ = pBVar4;
  local_158._16_8_ = pBVar3;
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
            ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             local_158);
  std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
  _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
           local_1c0);
  if ((void *)CONCAT44(local_1c0._84_4_,local_1c0._80_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_1c0._84_4_,local_1c0._80_4_));
  }
  return &pBVar8->_blob;
}

Assistant:

const std::vector < BlobInfo > & BlobDetection::find( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width,
                                                          uint32_t height, BlobParameters parameter, uint8_t threshold )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        parameter._verify();

        _blob.clear();

        // we make the area by 2 pixels bigger in each direction so we don't need to check borders of map
        std::vector < uint8_t > imageMap( (width + 2) * (height + 2), EMPTY );

        uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t mapWidth = width + 2;

        std::vector < uint8_t >::iterator mapValueX = imageMap.begin() + mapWidth + 1;

        for( ; imageY != imageYEnd; imageY += rowSize, mapValueX += mapWidth ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint8_t >::iterator mapValueY = mapValueX;

            for( ; imageX != imageXEnd; ++imageX, ++mapValueY ) {
                if( (*imageX) >= threshold )
                    *mapValueY = NOT_IN_USE;
            }
        }

        // find all blobs
        std::list < BlobInfo > foundBlob;

        mapValueX = imageMap.begin() + mapWidth;
        std::vector < uint8_t >::const_iterator endMap = imageMap.end() - mapWidth;

        for( ; mapValueX != endMap; ++mapValueX ) {
            if( *mapValueX == NOT_IN_USE ) { // blob found!
                foundBlob.push_back( BlobInfo() );

                BlobInfo & newBlob = foundBlob.back();

                uint32_t relativePosition = static_cast<uint32_t>(mapValueX - imageMap.begin());

                std::vector < uint32_t > & pointX = newBlob._pointX;
                std::vector < uint32_t > & pointY = newBlob._pointY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                pointX.push_back( relativePosition % mapWidth + x - 1 );
                pointY.push_back( relativePosition / mapWidth + y - 1 );

                std::vector < uint32_t > & edgeX = newBlob._edgeX;
                std::vector < uint32_t > & edgeY = newBlob._edgeY;

                *mapValueX = FOUND;

                size_t pointId = 0;

                do {
                    uint32_t xMap = pointX[pointId];
                    uint32_t yMap = pointY[pointId++];

                    uint8_t neighbourCount = 0;

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + 2;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    if( neighbourCount != 8 ) {
                        edgeX.push_back( xMap );
                        edgeY.push_back( yMap );
                        *(position - 1 - mapWidth) = EDGE;
                    }
                } while( pointId != pointX.size() );

                // Now we can extract outer edge points or so called contour points
                std::vector < uint32_t > & contourX = newBlob._contourX;
                std::vector < uint32_t > & contourY = newBlob._contourY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                contourX.push_back( relativePosition % mapWidth + x - 1 );
                contourY.push_back( relativePosition / mapWidth + y - 1 );

                pointId = 0;

                *mapValueX = CONTOUR;

                do {
                    uint32_t xMap = contourX[pointId];
                    uint32_t yMap = contourY[pointId++];

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + 2;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }
                } while( pointId != contourX.size() );
            }
        }

        // All blobs found. Now we need to sort them
        if( parameter.circularity.checkMaximum || parameter.circularity.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getCircularity(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.circularity.checkMaximum && info.circularity() > parameter.circularity.maximum) ||
                       (parameter.circularity.checkMinimum && info.circularity() < parameter.circularity.minimum); } );
        }

        if( parameter.elongation.checkMaximum || parameter.elongation.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getElongation(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.elongation.checkMaximum && info.elongation() > parameter.elongation.maximum) ||
                       (parameter.elongation.checkMinimum && info.elongation() < parameter.elongation.minimum); } );
        }

        if( parameter.height.checkMaximum || parameter.height.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getHeight(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.height.checkMaximum && info.height() > parameter.height.maximum) ||
                       (parameter.height.checkMinimum && info.height() < parameter.height.minimum); } );
        }

        if( parameter.length.checkMaximum || parameter.length.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getLength(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.length.checkMaximum && info.length() > parameter.length.maximum) ||
                       (parameter.length.checkMinimum && info.length() < parameter.length.minimum); } );
        }

        if( parameter.size.checkMaximum || parameter.size.checkMinimum ) {
            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.size.checkMaximum && info.size() > parameter.size.maximum) ||
                       (parameter.size.checkMinimum && info.size() < parameter.size.minimum); } );
        }

        if( parameter.width.checkMaximum || parameter.width.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getWidth(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.width.checkMaximum && info.width() > parameter.width.maximum) ||
                       (parameter.width.checkMinimum && info.width() < parameter.width.minimum); } );
        }

        // prepare data for output
        std::vector <BlobInfo> blobTemp ( foundBlob.begin(), foundBlob.end() );
        std::swap( _blob, blobTemp );

        return get();
    }